

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  int iVar2;
  srv_role sVar3;
  uint uVar4;
  size_type sVar5;
  buffer *this_00;
  size_t sVar6;
  element_type *peVar7;
  element_type *peVar8;
  char *__addr_len;
  element_type *peVar9;
  undefined4 extraout_var;
  __atomic_base<unsigned_long> _Var10;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar12;
  ptr<req_msg> leave_req;
  ptr<peer> p;
  peer_itor pit;
  int32 srv_id;
  ptr<peer> pp;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  memory_order __b;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffc98;
  shared_ptr<nuraft::peer> *psVar13;
  shared_ptr<nuraft::peer> *in_stack_fffffffffffffca0;
  peer *this_01;
  ptr<req_msg> *in_stack_fffffffffffffca8;
  peer *in_stack_fffffffffffffcb0;
  unsigned_long *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  unsigned_long *in_stack_fffffffffffffcc8;
  buffer *in_stack_fffffffffffffce0;
  unsigned_long *in_stack_fffffffffffffce8;
  raft_server *in_stack_fffffffffffffd10;
  string local_228 [32];
  string local_208 [48];
  undefined1 local_1d8 [32];
  rpc_handler *in_stack_fffffffffffffe48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_178;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_170;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_168;
  string local_160 [36];
  uint local_13c;
  string local_138 [32];
  string local_118 [56];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_e0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_d8;
  size_t local_d0;
  string local_c8 [32];
  string local_a8 [36];
  int local_84;
  string local_80 [52];
  undefined4 local_4c;
  ulong local_48;
  undefined1 local_39;
  undefined8 local_38;
  element_type *local_18;
  memory_order local_10;
  __atomic_base<int> local_c;
  atomic<unsigned_long> local_8;
  
  local_38 = req_msg::log_entries(in_RDX);
  local_39 = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x216aa3);
  local_48 = srv_state::get_term((srv_state *)0x216aab);
  local_4c = 9;
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&>
            (in_stack_fffffffffffffcb8,(msg_type *)in_stack_fffffffffffffcb0,
             (int *)in_stack_fffffffffffffca8,(atomic<int> *)in_stack_fffffffffffffca0);
  sVar5 = std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::size((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  *)local_38);
  if (sVar5 == 1) {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[]((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  *)local_38,0);
    std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x216b1a);
    this_00 = log_entry::get_buf((log_entry *)in_stack_fffffffffffffcb0);
    sVar6 = buffer::size(this_00);
    if (sVar6 == 4) {
      sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x216ca9);
      if ((sVar3 != leader) ||
         (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffca8),
         bVar1)) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar1) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x216cfc);
          iVar2 = (*peVar7->_vptr_logger[7])();
          if (2 < iVar2) {
            peVar7 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x216d35);
            msg_if_given_abi_cxx11_
                      ((char *)local_a8,"this is not a leader, cannot handle RemoveServerRequest");
            (*peVar7->_vptr_logger[8])
                      (peVar7,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_rm_srv_req",0x176,local_a8);
            std::__cxx11::string::~string(local_a8);
          }
        }
        peVar8 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x216dcb);
        resp_msg::set_result_code(peVar8,NOT_LEADER);
        local_39 = 1;
        local_84 = 1;
        _Var11._M_pi = extraout_RDX_00;
      }
      else {
        check_srv_to_leave_timeout(in_stack_fffffffffffffd10);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x3b8));
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
          if (bVar1) {
            peVar7 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x216e4f);
            iVar2 = (*peVar7->_vptr_logger[7])();
            if (2 < iVar2) {
              peVar7 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x216e88);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x216ea4);
              uVar4 = peer::get_id((peer *)0x216eac);
              msg_if_given_abi_cxx11_
                        ((char *)local_c8,"previous to-be-removed server %d has not left yet",
                         (ulong)uVar4);
              (*peVar7->_vptr_logger[8])
                        (peVar7,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                         ,"handle_rm_srv_req",0x17e,local_c8);
              std::__cxx11::string::~string(local_c8);
            }
          }
          peVar8 = std::
                   __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x216f4a);
          resp_msg::set_result_code(peVar8,SERVER_IS_LEAVING);
          local_39 = 1;
          local_84 = 1;
          _Var11._M_pi = extraout_RDX_01;
        }
        else {
          local_d0 = in_RSI + 0x1e0;
          local_d8._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::begin(in_stack_fffffffffffffc98);
          local_e0._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::end(in_stack_fffffffffffffc98);
          while (bVar1 = std::__detail::operator!=(&local_d8,&local_e0), bVar1) {
            local_118._48_8_ =
                 std::__detail::
                 _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                              *)0x216fdc);
            std::shared_ptr<nuraft::peer>::shared_ptr
                      (in_stack_fffffffffffffca0,
                       (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc98);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x217012);
            bVar1 = peer::is_leave_flag_set((peer *)0x21701a);
            if (bVar1) {
              bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
              if (bVar1) {
                peVar7 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x217064);
                iVar2 = (*peVar7->_vptr_logger[7])();
                if (2 < iVar2) {
                  peVar7 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x21709d);
                  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2170b2);
                  uVar4 = peer::get_id((peer *)0x2170ba);
                  msg_if_given_abi_cxx11_
                            ((char *)local_118,
                             "leave flag of server %d is set, but the server has not left yet",
                             (ulong)uVar4);
                  (*peVar7->_vptr_logger[8])
                            (peVar7,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x18a,local_118);
                  std::__cxx11::string::~string(local_118);
                }
              }
              peVar8 = std::
                       __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x21716e);
              resp_msg::set_result_code(peVar8,SERVER_IS_LEAVING);
              local_39 = 1;
              local_84 = 1;
            }
            else {
              local_84 = 0;
            }
            std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2171aa);
            _Var11._M_pi = extraout_RDX_02;
            if (local_84 != 0) goto LAB_00217bd2;
            std::__detail::
            _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
            operator++((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                        *)in_stack_fffffffffffffca0);
          }
          if ((*(byte *)(in_RSI + 0xe9) & 1) == 0) {
            std::
            vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ::operator[]((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                          *)local_38,0);
            std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x217336);
            log_entry::get_buf((log_entry *)in_stack_fffffffffffffcb0);
            local_13c = buffer::get_int(in_stack_fffffffffffffce0);
            if (local_13c == *(uint *)(in_RSI + 0x38)) {
              bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
              if (bVar1) {
                peVar7 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2173b5);
                iVar2 = (*peVar7->_vptr_logger[7])();
                if (2 < iVar2) {
                  peVar7 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x2173ee);
                  msg_if_given_abi_cxx11_((char *)local_160,"cannot request to remove leader");
                  (*peVar7->_vptr_logger[8])
                            (peVar7,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x199,local_160);
                  std::__cxx11::string::~string(local_160);
                }
              }
              peVar8 = std::
                       __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x217484);
              resp_msg::set_result_code(peVar8,CANNOT_REMOVE_LEADER);
              local_39 = 1;
              local_84 = 1;
              _Var11._M_pi = extraout_RDX_04;
            }
            else {
              local_170._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   ::find(in_stack_fffffffffffffc98,(key_type *)0x2174c7);
              std::__detail::
              _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              ::_Node_const_iterator
                        ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                          *)in_stack_fffffffffffffca0,
                         (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                          *)in_stack_fffffffffffffc98);
              local_178._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   ::end(in_stack_fffffffffffffc98);
              bVar1 = std::__detail::operator==(&local_168,&local_178);
              if (bVar1) {
                bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
                if (bVar1) {
                  peVar7 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x217561);
                  iVar2 = (*peVar7->_vptr_logger[7])();
                  if (2 < iVar2) {
                    peVar7 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x21759a);
                    msg_if_given_abi_cxx11_
                              (&stack0xfffffffffffffe68,"server %d does not exist",(ulong)local_13c)
                    ;
                    (*peVar7->_vptr_logger[8])
                              (peVar7,3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                               ,"handle_rm_srv_req",0x1a0,&stack0xfffffffffffffe68);
                    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
                  }
                }
                peVar8 = std::
                         __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x217637);
                resp_msg::set_result_code(peVar8,SERVER_NOT_FOUND);
                local_39 = 1;
                local_84 = 1;
                _Var11._M_pi = extraout_RDX_05;
              }
              else {
                std::__detail::
                _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                              *)0x21766b);
                std::shared_ptr<nuraft::peer>::shared_ptr
                          (in_stack_fffffffffffffca0,
                           (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc98);
                std::
                __shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x217693);
                local_1d8._24_8_ = srv_state::get_term((srv_state *)0x21769b);
                local_1d8._20_4_ = 0xe;
                __addr_len = (char *)(in_RSI + 0x38);
                local_1d8._16_4_ = 0;
                peVar9 = std::
                         __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2176eb);
                iVar2 = (*peVar9->_vptr_log_store[2])();
                local_1d8._8_8_ = CONCAT44(extraout_var,iVar2) + -1;
                _Var10._M_i = in_RSI + 0xa0;
                local_c._M_i = 5;
                local_8.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var10._M_i;
                local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
                if (local_c._M_i - 1U < 2) {
                  local_18 = *(element_type **)_Var10._M_i;
                }
                else if (local_c._M_i == 5) {
                  local_18 = *(element_type **)_Var10._M_i;
                }
                else {
                  local_18 = *(element_type **)_Var10._M_i;
                }
                local_1d8._0_8_ = local_18;
                this_01 = (peer *)local_1d8;
                psVar13 = (shared_ptr<nuraft::peer> *)(local_1d8 + 8);
                cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int&,int,unsigned_long,unsigned_long>
                          (in_stack_fffffffffffffcc8,
                           (msg_type *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0)
                           ,(int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0,
                           (int *)in_stack_fffffffffffffca8,
                           (unsigned_long *)in_stack_fffffffffffffce0,in_stack_fffffffffffffce8);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x217812);
                peer::set_leave_flag((peer *)0x21781a);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x217829);
                bVar1 = peer::make_busy(this_01);
                if (bVar1) {
                  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x217856);
                  std::shared_ptr<nuraft::peer>::shared_ptr
                            ((shared_ptr<nuraft::peer> *)this_01,psVar13);
                  __addr_len = (char *)(in_RSI + 0x5a8);
                  peer::send_req((peer *)in_stack_fffffffffffffe60,
                                 (ptr<peer> *)in_stack_fffffffffffffe58,
                                 (ptr<req_msg> *)in_stack_fffffffffffffe50._M_pi,
                                 in_stack_fffffffffffffe48);
                  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2178a7);
                  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318))
                  ;
                  if (bVar1) {
                    peVar7 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x2178d8);
                    iVar2 = (*peVar7->_vptr_logger[7])();
                    if (3 < iVar2) {
                      peVar7 = std::
                               __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x21790b);
                      std::
                      __shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x21791d);
                      uVar4 = peer::get_id((peer *)0x217925);
                      msg_if_given_abi_cxx11_
                                ((char *)local_208,"sent leave request to peer %d",(ulong)uVar4);
                      __addr_len = "handle_rm_srv_req";
                      (*peVar7->_vptr_logger[8])
                                (peVar7,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                                 ,"handle_rm_srv_req",0x1b4,local_208);
                      std::__cxx11::string::~string(local_208);
                    }
                  }
                }
                else {
                  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x217a17);
                  peer::set_rsv_msg(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                                    (rpc_handler *)this_01);
                  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318))
                  ;
                  if (bVar1) {
                    peVar7 = std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x217a69);
                    iVar2 = (*peVar7->_vptr_logger[7])();
                    if (3 < iVar2) {
                      peVar7 = std::
                               __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)0x217a9c);
                      std::
                      __shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x217aae);
                      uVar4 = peer::get_id((peer *)0x217ab6);
                      msg_if_given_abi_cxx11_
                                ((char *)local_228,"peer %d is currently busy, keep the message",
                                 (ulong)uVar4);
                      __addr_len = "handle_rm_srv_req";
                      (*peVar7->_vptr_logger[8])
                                (peVar7,4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                                 ,"handle_rm_srv_req",0x1b7,local_228);
                      std::__cxx11::string::~string(local_228);
                    }
                  }
                }
                peVar8 = std::
                         __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x217b4a);
                peVar9 = std::
                         __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x217b63);
                iVar2 = (*peVar9->_vptr_log_store[2])();
                resp_msg::accept(peVar8,iVar2,__addr,(socklen_t *)__addr_len);
                local_39 = 1;
                local_84 = 1;
                std::shared_ptr<nuraft::req_msg>::~shared_ptr
                          ((shared_ptr<nuraft::req_msg> *)0x217ba7);
                std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x217bb4);
                _Var11._M_pi = extraout_RDX_06;
              }
            }
          }
          else {
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
            if (bVar1) {
              peVar7 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x217227);
              iVar2 = (*peVar7->_vptr_logger[7])();
              if (2 < iVar2) {
                peVar7 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x217260);
                msg_if_given_abi_cxx11_((char *)local_138,"previous config has not committed yet");
                (*peVar7->_vptr_logger[8])
                          (peVar7,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                           ,"handle_rm_srv_req",0x192,local_138);
                std::__cxx11::string::~string(local_138);
              }
            }
            peVar8 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2172f6);
            resp_msg::set_result_code(peVar8,CONFIG_CHANGING);
            local_39 = 1;
            local_84 = 1;
            _Var11._M_pi = extraout_RDX_03;
          }
        }
      }
      goto LAB_00217bd2;
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar1) {
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x216b86);
    iVar2 = (*peVar7->_vptr_logger[7])();
    if (2 < iVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x216bbf);
      msg_if_given_abi_cxx11_
                ((char *)local_80,
                 "bad remove server request as we are expecting one log entry with value type of int"
                );
      (*peVar7->_vptr_logger[8])
                (peVar7,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_rm_srv_req",0x170,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  peVar8 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x216c6e);
  resp_msg::set_result_code(peVar8,BAD_REQUEST);
  local_39 = 1;
  local_84 = 1;
  _Var11._M_pi = extraout_RDX;
LAB_00217bd2:
  if ((local_39 & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x217be9);
    _Var11._M_pi = extraout_RDX_07;
  }
  pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::remove_server_response,
                           id_,
                           leader_ );

    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int) {
        p_wn("bad remove server request as we are expecting "
             "one log entry with value type of int");
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_wn("this is not a leader, cannot handle RemoveServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    check_srv_to_leave_timeout();
    if (srv_to_leave_) {
        p_wn("previous to-be-removed server %d has not left yet",
             srv_to_leave_->get_id());
        resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
        return resp;
    }
    // NOTE:
    //   Although `srv_to_leave_` is not set, we should check if
    //   there is any peer whose leave flag is set.
    for (auto& entry: peers_) {
        ptr<peer> pp = entry.second;
        if (pp->is_leave_flag_set()) {
            p_wn("leave flag of server %d is set, but the server "
                 "has not left yet",
                 pp->get_id());
            resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
            return resp;
        }
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_) {
        p_wn("cannot request to remove leader");
        resp->set_result_code(cmd_result_code::CANNOT_REMOVE_LEADER);
        return resp;
    }

    peer_itor pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_wn("server %d does not exist", srv_id);
        resp->set_result_code(cmd_result_code::SERVER_NOT_FOUND);
        return resp;
    }

    ptr<peer> p = pit->second;
    ptr<req_msg> leave_req( cs_new<req_msg>
                            ( state_->get_term(),
                              msg_type::leave_cluster_request,
                              id_, srv_id, 0,
                              log_store_->next_slot() - 1,
                              quick_commit_index_.load() ) );
    // WARNING:
    //   DO NOT reset HB counter to 0 as removing server
    //   may be requested multiple times, and anyway we should
    //   remove that server.
    p->set_leave_flag();

    if (p->make_busy()) {
        p->send_req(p, leave_req, ex_resp_handler_);
        p_in("sent leave request to peer %d", p->get_id());
    } else {
        p->set_rsv_msg(leave_req, ex_resp_handler_);
        p_in("peer %d is currently busy, keep the message", p->get_id());
    }

    resp->accept(log_store_->next_slot());
    return resp;
}